

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_compare.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  
  pcVar8 = *argv;
  uVar7 = 0;
LAB_001012c6:
  iVar5 = getopt(argc,argv,"pahv");
  if (0x67 < iVar5) {
    uVar6 = 1;
    if (iVar5 != 0x70) {
      if (iVar5 == 0x68) {
LAB_0010148d:
        print_usage(pcVar8);
      }
      else {
        if (iVar5 != 0x76) {
LAB_001014a2:
          print_usage(pcVar8);
          return 1;
        }
        main_cold_1();
      }
      return 0;
    }
LAB_001012f3:
    uVar7 = uVar7 | uVar6;
    goto LAB_001012c6;
  }
  if (iVar5 == 0x61) {
    uVar6 = 2;
    goto LAB_001012f3;
  }
  if (iVar5 != -1) {
    if (iVar5 != 0x3f) goto LAB_001014a2;
    goto LAB_0010148d;
  }
  lVar9 = (long)_optind;
  if (argc - _optind != 3) {
    if (argc - _optind == 2) {
      iVar5 = version_compare4(argv[lVar9],argv[lVar9 + 1],uVar7);
      if (iVar5 < 0) {
        pcVar8 = "<";
      }
      else if (iVar5 == 0) {
        pcVar8 = "=";
      }
      else {
        pcVar8 = ">";
      }
      puts(pcVar8);
      return 0;
    }
    goto LAB_001014a2;
  }
  uVar7 = version_compare4(argv[lVar9],argv[lVar9 + 2],uVar7,uVar7);
  pcVar2 = argv[lVar9 + 1];
  cVar1 = *pcVar2;
  if (cVar1 == 'l') {
    if ((pcVar2[1] == 't') && (pcVar2[2] == '\0')) {
LAB_001014ba:
      uVar7 = ~uVar7;
      goto LAB_001014bc;
    }
    if ((pcVar2[1] == 'e') && (pcVar2[2] == '\0')) goto LAB_001014b1;
  }
  else {
    if (cVar1 == '=') {
      if ((pcVar2[1] == '<') && (pcVar2[2] == '\0')) {
LAB_001014b1:
        return (uint)(0 < (int)uVar7);
      }
      bVar3 = true;
      if (pcVar2[1] == '\0') goto LAB_001014c3;
      goto LAB_001013f9;
    }
    if (cVar1 == '<') {
      if (pcVar2[1] == '\0') goto LAB_001014ba;
      if (pcVar2[1] != '=') goto LAB_001013f7;
      if (pcVar2[2] == '\0') goto LAB_001014b1;
      goto LAB_001014a2;
    }
  }
LAB_001013f7:
  bVar3 = false;
LAB_001013f9:
  if (cVar1 == '>') {
    bVar4 = true;
    if ((pcVar2[1] == '=') && (pcVar2[2] == '\0')) goto LAB_001014bc;
LAB_00101441:
    if (bVar3) goto LAB_00101446;
  }
  else {
    if (cVar1 != 'e') {
      bVar4 = false;
      goto LAB_00101441;
    }
    if ((pcVar2[1] == 'q') && (pcVar2[2] == '\0')) {
LAB_001014c3:
      return (uint)(uVar7 != 0);
    }
    if (!bVar3) goto LAB_001014a2;
    bVar4 = false;
LAB_00101446:
    if ((pcVar2[1] == '>') && (pcVar2[2] == '\0')) goto LAB_001014bc;
  }
  if ((cVar1 == 'g') && ((pcVar2[1] == 'e' && (pcVar2[2] == '\0')))) {
LAB_001014bc:
    return uVar7 >> 0x1f;
  }
  if (((bVar4) && (pcVar2[1] == '\0')) ||
     ((cVar1 == 'g' && ((pcVar2[1] == 't' && (pcVar2[2] == '\0')))))) {
    return (uint)((int)uVar7 < 1);
  }
  goto LAB_001014a2;
}

Assistant:

int main(int argc, char** argv) {
	int ch, result, flags = 0;
	const char* progname = argv[0];

	while ((ch = getopt(argc, argv, "pahv")) != -1) {
		switch (ch) {
		case 'p':
			flags |= VERSIONFLAG_P_IS_PATCH;
			break;
		case 'a':
			flags |= VERSIONFLAG_ANY_IS_PATCH;
			break;
		case 'h':
		case '?':
			print_usage(progname);
			return 0;
		case 'v':
			print_version();
			return 0;
		default:
			print_usage(progname);
			return 1;
		}
	}

	argc -= optind;
	argv += optind;

	if (argc == 2) {
		result = version_compare4(argv[0], argv[1], flags, flags);

		if (result < 0)
			printf("<\n");
		else if (result > 0)
			printf(">\n");
		else
			printf("=\n");

		return 0;
	} else if (argc == 3) {
		result = version_compare4(argv[0], argv[2], flags, flags);

		if (streq(argv[1], "<") || streq(argv[1], "lt"))
			return !(result < 0);
		else if (streq(argv[1], "<=") || streq(argv[1], "=<") || streq(argv[1], "le"))
			return !(result <= 0);
		else if (streq(argv[1], "=") || streq(argv[1], "=") || streq(argv[1], "eq"))
			return !(result == 0);
		else if (streq(argv[1], ">=") || streq(argv[1], "=>") || streq(argv[1], "ge"))
			return !(result >= 0);
		else if (streq(argv[1], ">") || streq(argv[1], "gt"))
			return !(result > 0);
	}

	print_usage(progname);
	return 1;
}